

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

bool merlin::dominates(set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *A,set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                          *B)

{
  bool bVar1;
  iterator __first1;
  iterator __last1;
  iterator __first2;
  iterator __last2;
  iterator __i;
  insert_iterator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>
  __result;
  undefined1 local_48 [8];
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> temp;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *B_local;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *A_local;
  
  temp._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)B;
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             local_48);
  __first1 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
             begin(A);
  __last1 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                      (A);
  __first2 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
             begin((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   temp._M_t._M_impl.super__Rb_tree_header._M_node_count);
  __last2 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                      ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)temp._M_t._M_impl.super__Rb_tree_header._M_node_count);
  __i = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::begin
                  ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   local_48);
  __result = std::
             inserter<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>
                       ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)local_48,__i);
  std::
  set_intersection<std::_Rb_tree_const_iterator<unsigned_long>,std::_Rb_tree_const_iterator<unsigned_long>,std::insert_iterator<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>
            ((_Rb_tree_const_iterator<unsigned_long>)__first1._M_node,
             (_Rb_tree_const_iterator<unsigned_long>)__last1._M_node,
             (_Rb_tree_const_iterator<unsigned_long>)__first2._M_node,
             (_Rb_tree_const_iterator<unsigned_long>)__last2._M_node,__result);
  bVar1 = std::operator==((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)local_48,
                          (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)temp._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             local_48);
  return bVar1;
}

Assistant:

bool dominates(std::set<size_t>& A, std::set<size_t>& B) {
	std::set<size_t> temp;
	std::set_intersection(A.begin(), A.end(),
			B.begin(), B.end(),
			std::inserter(temp, temp.begin()));

	return (temp == B);
}